

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<std::__cxx11::list<long,std::allocator<long>>>
               (list<long,_std::allocator<long>_> *value,ostream *os)

{
  ostream *os_local;
  list<long,_std::allocator<long>_> *value_local;
  
  ContainerPrinter::PrintValue<std::__cxx11::list<long,std::allocator<long>>,void>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}